

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxintegration.cpp
# Opt level: O2

Window createDummyWindow(Display *dpy,GLXFBConfig config,int screenNumber,Window rootWin)

{
  XVisualInfo *visualInfo;
  Window WVar1;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  visualInfo = (XVisualInfo *)glXGetVisualFromFBConfig();
  if (visualInfo == (XVisualInfo *)0x0) {
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_30 = "default";
    QMessageLogger::fatal(local_48,"Could not initialize GLX");
  }
  else {
    WVar1 = createDummyWindow(dpy,visualInfo,screenNumber,rootWin);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      XFree(visualInfo);
      return WVar1;
    }
  }
  __stack_chk_fail();
}

Assistant:

static Window createDummyWindow(Display *dpy, GLXFBConfig config, int screenNumber, Window rootWin)
{
    XVisualInfo *visualInfo = glXGetVisualFromFBConfig(dpy, config);
    if (Q_UNLIKELY(!visualInfo))
        qFatal("Could not initialize GLX");
    Window window = createDummyWindow(dpy, visualInfo, screenNumber, rootWin);
    XFree(visualInfo);
    return window;
}